

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cfd_elements_transaction.cpp
# Opt level: O1

ConfidentialTxOutReference * __thiscall
cfd::ConfidentialTransactionController::UpdateTxOutFeeAmount
          (ConfidentialTxOutReference *__return_storage_ptr__,
          ConfidentialTransactionController *this,uint32_t index,Amount *value,
          ConfidentialAssetId *asset)

{
  bool bVar1;
  CfdException *this_00;
  ConfidentialTransaction *this_01;
  ConfidentialTxOutReference ref;
  Script local_1b8;
  ByteData local_180;
  ConfidentialNonce local_168;
  ByteData local_140;
  ConfidentialTxOutReference local_128;
  
  this_01 = &this->transaction_;
  core::ConfidentialTransaction::GetTxOut(&local_128,this_01,index);
  core::Script::Script(&local_1b8,&local_128.super_AbstractTxOutReference.locking_script_);
  bVar1 = core::Script::IsEmpty(&local_1b8);
  core::Script::~Script(&local_1b8);
  if (bVar1) {
    core::ConfidentialValue::ConfidentialValue((ConfidentialValue *)&local_1b8,value);
    core::ConfidentialNonce::ConfidentialNonce(&local_168);
    core::ByteData::ByteData(&local_180);
    core::ByteData::ByteData(&local_140);
    core::ConfidentialTransaction::SetTxOutCommitment
              (this_01,index,asset,(ConfidentialValue *)&local_1b8,&local_168,&local_180,&local_140)
    ;
    if (local_140.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
        super__Vector_impl_data._M_start != (pointer)0x0) {
      operator_delete(local_140.data_.
                      super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                      super__Vector_impl_data._M_start);
    }
    if (local_180.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
        super__Vector_impl_data._M_start != (pointer)0x0) {
      operator_delete(local_180.data_.
                      super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                      super__Vector_impl_data._M_start);
    }
    local_168._vptr_ConfidentialNonce = (_func_int **)&PTR__ConfidentialNonce_007356c0;
    if (local_168.data_.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
        _M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
      operator_delete(local_168.data_.data_.
                      super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                      super__Vector_impl_data._M_start);
    }
    local_1b8._vptr_Script = (_func_int **)&PTR__ConfidentialValue_007357f0;
    if (local_1b8.script_data_.data_.
        super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
        super__Vector_impl_data._M_start != (pointer)0x0) {
      operator_delete(local_1b8.script_data_.data_.
                      super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                      super__Vector_impl_data._M_start);
    }
    core::ConfidentialTransaction::GetTxOut(__return_storage_ptr__,this_01,index);
    core::ConfidentialTxOutReference::~ConfidentialTxOutReference(&local_128);
    return __return_storage_ptr__;
  }
  this_00 = (CfdException *)__cxa_allocate_exception(0x30);
  local_1b8._vptr_Script =
       (_func_int **)
       ((long)&local_1b8.script_data_.data_.
               super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
               super__Vector_impl_data + 8);
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&local_1b8,"target is not fee txout.","");
  core::CfdException::CfdException(this_00,kCfdIllegalArgumentError,(string *)&local_1b8);
  __cxa_throw(this_00,&core::CfdException::typeinfo,core::CfdException::~CfdException);
}

Assistant:

const ConfidentialTxOutReference
ConfidentialTransactionController::UpdateTxOutFeeAmount(
    uint32_t index, const Amount& value, const ConfidentialAssetId& asset) {
  ConfidentialTxOutReference ref = transaction_.GetTxOut(index);
  if (!ref.GetLockingScript().IsEmpty()) {
    throw CfdException(
        CfdError::kCfdIllegalArgumentError, "target is not fee txout.");
  }
  transaction_.SetTxOutCommitment(
      index, asset, ConfidentialValue(value), ConfidentialNonce(), ByteData(),
      ByteData());
  return transaction_.GetTxOut(index);
}